

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

VNode * despot::DESPOT::Trial
                  (VNode *root,RandomStreams *streams,ScenarioLowerBound *lower_bound,
                  ScenarioUpperBound *upper_bound,DSPOMDP *model,History *history,
                  SearchStatistics *statistics)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this;
  size_type sVar4;
  clock_t cVar5;
  QNode *qnode;
  VNode *this_00;
  clock_t cVar6;
  OBS_TYPE obs;
  double dVar7;
  VNode *next;
  QNode *qstar;
  double start;
  double start_1;
  VNode *pVStack_40;
  int hist_size;
  VNode *cur;
  History *history_local;
  DSPOMDP *model_local;
  ScenarioUpperBound *upper_bound_local;
  ScenarioLowerBound *lower_bound_local;
  RandomStreams *streams_local;
  VNode *root_local;
  
  sVar3 = History::Size(history);
  pVStack_40 = root;
  do {
    if ((statistics != (SearchStatistics *)0x0) &&
       (iVar2 = VNode::depth(pVStack_40), statistics->longest_trial_length < iVar2)) {
      iVar2 = VNode::depth(pVStack_40);
      statistics->longest_trial_length = iVar2;
    }
    ExploitBlockers(pVStack_40);
    dVar7 = Gap(pVStack_40);
    if ((dVar7 == 0.0) && (!NAN(dVar7))) break;
    bVar1 = VNode::IsLeaf(pVStack_40);
    if (bVar1) {
      cVar5 = clock();
      Expand(pVStack_40,lower_bound,upper_bound,model,streams,history);
      if (statistics != (SearchStatistics *)0x0) {
        cVar6 = clock();
        statistics->time_node_expansion =
             ((double)cVar6 - (double)cVar5) / 1000000.0 + statistics->time_node_expansion;
        statistics->num_expanded_nodes = statistics->num_expanded_nodes + 1;
        this = VNode::particles(pVStack_40);
        sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this);
        statistics->num_tree_particles = statistics->num_tree_particles + (int)sVar4;
      }
    }
    cVar5 = clock();
    qnode = SelectBestUpperBoundNode(pVStack_40);
    this_00 = SelectBestWEUNode(qnode);
    if (statistics != (SearchStatistics *)0x0) {
      cVar6 = clock();
      statistics->time_path = ((double)cVar6 - (double)cVar5) / 1000000.0 + statistics->time_path;
    }
    if (this_00 == (VNode *)0x0) break;
    iVar2 = QNode::edge(qnode);
    obs = VNode::edge(this_00);
    History::Add(history,iVar2,obs);
    iVar2 = VNode::depth(this_00);
    bVar1 = false;
    if (iVar2 < DAT_00278a70) {
      dVar7 = WEU(this_00);
      bVar1 = 0.0 < dVar7;
    }
    pVStack_40 = this_00;
  } while (bVar1);
  History::Truncate(history,(int)sVar3);
  return pVStack_40;
}

Assistant:

VNode* DESPOT::Trial(VNode* root, RandomStreams& streams,
	ScenarioLowerBound* lower_bound, ScenarioUpperBound* upper_bound,
	const DSPOMDP* model, History& history, SearchStatistics* statistics) {
	VNode* cur = root;

	int hist_size = history.Size();

	do {
		if (statistics != NULL
			&& cur->depth() > statistics->longest_trial_length) {
			statistics->longest_trial_length = cur->depth();
		}

		ExploitBlockers(cur);

		if (Gap(cur) == 0) {
			break;
		}

		if (cur->IsLeaf()) {
			double start = clock();
			Expand(cur, lower_bound, upper_bound, model, streams, history);

			if (statistics != NULL) {
				statistics->time_node_expansion += (double) (clock() - start)
					/ CLOCKS_PER_SEC;
				statistics->num_expanded_nodes++;
				statistics->num_tree_particles += cur->particles().size();
			}
		}

		double start = clock();
		QNode* qstar = SelectBestUpperBoundNode(cur);
		VNode* next = SelectBestWEUNode(qstar);

		if (statistics != NULL) {
			statistics->time_path += (clock() - start) / CLOCKS_PER_SEC;
		}

		if (next == NULL) {
			break;
		}

		cur = next;
		history.Add(qstar->edge(), cur->edge());
	} while (cur->depth() < Globals::config.search_depth && WEU(cur) > 0);

	history.Truncate(hist_size);

	return cur;
}